

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_fragment.cpp
# Opt level: O2

error_code
anon_unknown.dwarf_5dc84f::validate_section_ifixups<pstore::repo::generic_section>
          (fragment *f,generic_section *s)

{
  uint uVar1;
  const_pointer piVar2;
  long lVar3;
  const_pointer piVar4;
  error e;
  long lVar5;
  container<pstore::repo::internal_fixup> cVar6;
  error_code eVar7;
  
  cVar6 = pstore::repo::generic_section::ifixups(s);
  piVar4 = cVar6.end_;
  piVar2 = cVar6.begin_;
  lVar5 = (long)piVar4 - (long)piVar2;
  uVar1 = (f->arr_).sa_.bitmap_;
  for (lVar3 = lVar5 / 0x18 >> 2; 0 < lVar3; lVar3 = lVar3 + -1) {
    if (((debug_string|debug_loc) < piVar2->section) ||
       ((1 << (piVar2->section & (debug_string|debug_loc)) & uVar1) == 0)) goto LAB_001a0aa2;
    if (((debug_string|debug_loc) < piVar2[1].section) ||
       ((1 << (piVar2[1].section & (debug_string|debug_loc)) & uVar1) == 0)) {
      piVar2 = piVar2 + 1;
      goto LAB_001a0aa2;
    }
    if (((debug_string|debug_loc) < piVar2[2].section) ||
       ((1 << (piVar2[2].section & (debug_string|debug_loc)) & uVar1) == 0)) {
      piVar2 = piVar2 + 2;
      goto LAB_001a0aa2;
    }
    if (((debug_string|debug_loc) < piVar2[3].section) ||
       ((1 << (piVar2[3].section & (debug_string|debug_loc)) & uVar1) == 0)) {
      piVar2 = piVar2 + 3;
      goto LAB_001a0aa2;
    }
    piVar2 = piVar2 + 4;
    lVar5 = lVar5 + -0x60;
  }
  lVar5 = lVar5 / 0x18;
  if (lVar5 == 1) {
LAB_001a0a7e:
    if (((debug_string|debug_loc) < piVar2->section) ||
       ((1 << (piVar2->section & (debug_string|debug_loc)) & uVar1) == 0)) goto LAB_001a0aa2;
  }
  else {
    if (lVar5 == 2) {
LAB_001a0a69:
      if (((debug_string|debug_loc) < piVar2->section) ||
         ((1 << (piVar2->section & (debug_string|debug_loc)) & uVar1) == 0)) goto LAB_001a0aa2;
      piVar2 = piVar2 + 1;
      goto LAB_001a0a7e;
    }
    if (lVar5 == 3) {
      if (((debug_string|debug_loc) < piVar2->section) ||
         ((1 << (piVar2->section & (debug_string|debug_loc)) & uVar1) == 0)) goto LAB_001a0aa2;
      piVar2 = piVar2 + 1;
      goto LAB_001a0a69;
    }
  }
  piVar2 = piVar4;
LAB_001a0aa2:
  e = internal_fixup_target_not_found;
  if (piVar2 == piVar4) {
    e = none;
  }
  eVar7 = pstore::exchange::import_ns::make_error_code(e);
  return eVar7;
}

Assistant:

std::error_code validate_section_ifixups (pstore::repo::fragment const & f, Section const & s) {
        using pstore::exchange::import_ns::error;

        auto const container = s.ifixups ();
        return std::any_of (std::begin (container), std::end (container),
                            [&] (pstore::repo::internal_fixup const & ifx) {
                                return !f.has_section (ifx.section);
                            })
                   ? error::internal_fixup_target_not_found
                   : error::none;
    }